

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateScaleLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  bool bVar2;
  WeightParamType WVar3;
  WeightParamType WVar4;
  uint uVar5;
  ScaleLayerParams *this_00;
  uint64 uVar6;
  int i;
  int iVar7;
  WeightParams *pWVar8;
  string *psVar9;
  uint64_t uVar10;
  string err;
  string err_2;
  string local_e0;
  Result r;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  Result::Result(&r);
  validateInputCount((Result *)&err_2,layer,1,1);
  Result::operator=(&r,(Result *)&err_2);
  std::__cxx11::string::~string((string *)&err_2._M_string_length);
  bVar1 = Result::good(&r);
  if (bVar1) {
    validateOutputCount((Result *)&err_2,layer,1,1);
    Result::operator=(&r,(Result *)&err_2);
    std::__cxx11::string::~string((string *)&err_2._M_string_length);
  }
  bVar1 = Result::good(&r);
  if (bVar1) {
    if (this->ndArrayInterpretation != true) {
LAB_00249e97:
      this_00 = Specification::NeuralNetworkLayer::scale(layer);
      pWVar8 = this_00->scale_;
      if (pWVar8 == (WeightParams *)0x0) {
        pWVar8 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      bVar1 = this_00->hasbias_;
      WVar3 = valueType(pWVar8);
      pWVar8 = this_00->bias_;
      if (pWVar8 == (WeightParams *)0x0) {
        pWVar8 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      WVar4 = valueType(pWVar8);
      if ((WVar3 == UNSPECIFIED) || ((WVar4 == UNSPECIFIED & bVar1) != 0)) {
        std::operator+(&err_2,"Scale layer \'",(layer->name_).ptr_);
        std::operator+(&err,&err_2,"\' has invalid scale/bias fields.");
        std::__cxx11::string::~string((string *)&err_2);
        Result::Result((Result *)&err_2,INVALID_MODEL_PARAMETERS,&err);
LAB_00249f9c:
        Result::operator=(&r,(Result *)&err_2);
        std::__cxx11::string::~string((string *)&err_2._M_string_length);
        Result::Result(__return_storage_ptr__,&r);
        psVar9 = &err;
      }
      else {
        if ((bVar1 != false) &&
           (((WVar3 == FLOAT16 && (WVar4 == FLOAT32)) || ((WVar3 == FLOAT32 && (WVar4 == FLOAT16))))
           )) {
          std::operator+(&err_2,"Scale layer \'",(layer->name_).ptr_);
          std::operator+(&err,&err_2,
                         "\' has invalid scale/bias fields. Field value types should match and should either be half or full precision."
                        );
          std::__cxx11::string::~string((string *)&err_2);
          Result::Result((Result *)&err_2,INVALID_MODEL_PARAMETERS,&err);
          goto LAB_00249f9c;
        }
        uVar5 = (this_00->shapescale_).current_size_;
        if ((uVar5 | 2) == 3) {
          uVar10 = 1;
          for (iVar7 = 0; iVar7 < (int)uVar5; iVar7 = iVar7 + 1) {
            uVar6 = Specification::ScaleLayerParams::shapescale(this_00,iVar7);
            uVar10 = uVar10 * uVar6;
            uVar5 = (this_00->shapescale_).current_size_;
          }
          if (uVar5 == 3) {
            uVar6 = Specification::ScaleLayerParams::shapescale(this_00,0);
            if (uVar6 < 2) goto LAB_0024a0a4;
            pWVar8 = this_00->scale_;
            if (pWVar8 == (WeightParams *)0x0) {
              pWVar8 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            uVar6 = Specification::ScaleLayerParams::shapescale(this_00,0);
            std::__cxx11::string::string((string *)&err,"Scale",(allocator *)&local_70);
            psVar9 = (layer->name_).ptr_;
            std::__cxx11::string::string((string *)&local_e0,"scale",(allocator *)&local_90);
            validateGeneralWeightParams((Result *)&err_2,pWVar8,uVar10,uVar6,&err,psVar9,&local_e0);
          }
          else {
LAB_0024a0a4:
            pWVar8 = this_00->scale_;
            if (pWVar8 == (WeightParams *)0x0) {
              pWVar8 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            std::__cxx11::string::string((string *)&err,"Scale",(allocator *)&local_70);
            psVar9 = (layer->name_).ptr_;
            std::__cxx11::string::string((string *)&local_e0,"scale",(allocator *)&local_90);
            validateGeneralWeightParams((Result *)&err_2,pWVar8,uVar10,1,&err,psVar9,&local_e0);
          }
          Result::operator=(&r,(Result *)&err_2);
          std::__cxx11::string::~string((string *)&err_2._M_string_length);
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)&err);
          bVar2 = Result::good(&r);
          if (!bVar2) goto LAB_0024a38d;
          if (bVar1 != false) {
            uVar5 = (this_00->shapebias_).current_size_;
            if ((uVar5 | 2) != 3) {
              std::operator+(&local_70,"The bias vector for scale layer \'",(layer->name_).ptr_);
              std::operator+(&local_e0,&local_70,"\' is ");
              std::__cxx11::to_string(&local_90,(this_00->shapebias_).current_size_);
              std::operator+(&err,&local_e0,&local_90);
              std::operator+(&err_2,&err," dimensional but should be either 1D or 3D.");
              std::__cxx11::string::~string((string *)&err);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::~string((string *)&local_e0);
              std::__cxx11::string::~string((string *)&local_70);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err_2);
              goto LAB_0024a246;
            }
            uVar10 = 1;
            for (iVar7 = 0; iVar7 < (int)uVar5; iVar7 = iVar7 + 1) {
              uVar6 = Specification::ScaleLayerParams::shapebias(this_00,iVar7);
              uVar10 = uVar10 * uVar6;
              uVar5 = (this_00->shapebias_).current_size_;
            }
            if (uVar5 == 3) {
              uVar6 = Specification::ScaleLayerParams::shapebias(this_00,0);
              if (uVar6 < 2) goto LAB_0024a2e0;
              pWVar8 = this_00->bias_;
              if (pWVar8 == (WeightParams *)0x0) {
                pWVar8 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              uVar6 = Specification::ScaleLayerParams::shapebias(this_00,0);
              std::__cxx11::string::string((string *)&err,"Scale",(allocator *)&local_70);
              psVar9 = (layer->name_).ptr_;
              std::__cxx11::string::string((string *)&local_e0,"bias",(allocator *)&local_90);
              validateGeneralWeightParams
                        ((Result *)&err_2,pWVar8,uVar10,uVar6,&err,psVar9,&local_e0);
            }
            else {
LAB_0024a2e0:
              pWVar8 = this_00->bias_;
              if (pWVar8 == (WeightParams *)0x0) {
                pWVar8 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              std::__cxx11::string::string((string *)&err,"Scale",(allocator *)&local_70);
              psVar9 = (layer->name_).ptr_;
              std::__cxx11::string::string((string *)&local_e0,"bias",(allocator *)&local_90);
              validateGeneralWeightParams((Result *)&err_2,pWVar8,uVar10,1,&err,psVar9,&local_e0);
            }
            Result::operator=(&r,(Result *)&err_2);
            std::__cxx11::string::~string((string *)&err_2._M_string_length);
            std::__cxx11::string::~string((string *)&local_e0);
            std::__cxx11::string::~string((string *)&err);
            bVar1 = Result::good(&r);
            if (!bVar1) goto LAB_0024a38d;
          }
          Result::Result(__return_storage_ptr__);
          goto LAB_0024a39a;
        }
        std::operator+(&local_70,"The shape vector for the scale layer \'",(layer->name_).ptr_);
        std::operator+(&local_e0,&local_70,"\' is ");
        std::__cxx11::to_string(&local_90,(this_00->shapescale_).current_size_);
        std::operator+(&err,&local_e0,&local_90);
        std::operator+(&err_2,&err," dimensional but should be 1D or 3D.");
        std::__cxx11::string::~string((string *)&err);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_70);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err_2);
LAB_0024a246:
        psVar9 = &err_2;
      }
      std::__cxx11::string::~string((string *)psVar9);
      goto LAB_0024a39a;
    }
    std::__cxx11::string::string((string *)&local_50,"Scale",(allocator *)&err);
    validateInputOutputRankEquality((Result *)&err_2,layer,&local_50,&this->blobNameToRank);
    Result::operator=(&r,(Result *)&err_2);
    std::__cxx11::string::~string((string *)&err_2._M_string_length);
    std::__cxx11::string::~string((string *)&local_50);
    bVar1 = Result::good(&r);
    if (bVar1) {
      std::__cxx11::string::string((string *)&err,"Scale",(allocator *)&local_e0);
      validateRankCount((Result *)&err_2,layer,&err,3,-1,&this->blobNameToRank);
      Result::operator=(&r,(Result *)&err_2);
      std::__cxx11::string::~string((string *)&err_2._M_string_length);
      std::__cxx11::string::~string((string *)&err);
      bVar1 = Result::good(&r);
      if (bVar1) goto LAB_00249e97;
    }
  }
LAB_0024a38d:
  Result::Result(__return_storage_ptr__,&r);
LAB_0024a39a:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateScaleLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    if (!r.good()) {
        return r;
    }

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Scale", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Scale", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.scale();

    bool has_bias = params.hasbias();
    WeightParamType scaleValueType, biasValueType;
    scaleValueType = valueType(params.scale());
    biasValueType = valueType(params.bias());

    // Check for scale and bias value type. Only float32 or float16 parameters can be populated at any time.
    // Both bias and weights should have the same value types
    if ( (scaleValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)) {
        std::string err = "Scale layer '" + layer.name() + "' has invalid scale/bias fields.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    if (has_bias){
        if ((scaleValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (scaleValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)){
            const std::string err = "Scale layer '" + layer.name() +
            "' has invalid scale/bias fields. Field value types should match and should either be half or full precision.";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            return r;
        }
    }

    // Checks scale shape and size
    if (!(params.shapescale_size() == 1 || params.shapescale_size() == 3)) { // check shape
        std::string err = "The shape vector for the scale layer '" + layer.name() + "' is " +
        std::to_string(params.shapescale_size()) + " dimensional but should be 1D or 3D.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    size_t total_scale_shape = 1;
    for (int i = 0; i < params.shapescale_size(); i++) {
        total_scale_shape *= params.shapescale(i);
    }

    if (params.shapescale_size() == 3 && params.shapescale(0) > 1){
        r = validateGeneralWeightParams(params.scale(), total_scale_shape, params.shapescale(0), "Scale", layer.name(), "scale");
    } else {
        r = validateGeneralWeightParams(params.scale(), total_scale_shape, 1, "Scale", layer.name(), "scale");
    }
    if (!r.good()) return r;

    // Checks bias shape and size
    if (has_bias) {
        if (!(params.shapebias_size() == 1 || params.shapebias_size() == 3)) {
            std::string err = "The bias vector for scale layer '" + layer.name() + "' is " +
            std::to_string(params.shapebias_size()) + " dimensional but should be either 1D or 3D.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        size_t total_bias_shape = 1;
        for (int i = 0; i < params.shapebias_size(); i++) {
            total_bias_shape *= params.shapebias(i);
        }
        if (params.shapebias_size() == 3 && params.shapebias(0) > 1){
            r = validateGeneralWeightParams(params.bias(), total_bias_shape, params.shapebias(0), "Scale", layer.name(), "bias");
        } else {
            r = validateGeneralWeightParams(params.bias(), total_bias_shape, 1, "Scale", layer.name(), "bias");
        }
        if (!r.good()) return r;
    }
    return Result();
}